

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O3

void __thiscall
SoundConfigTab::apiChanged<AudioEnumerator>
          (SoundConfigTab *this,AudioEnumerator *enumerator,DeviceGroup *group,int index)

{
  QComboBox *pQVar1;
  QLabel *pQVar2;
  bool bVar3;
  
  pQVar1 = group->mDeviceCombo;
  if (pQVar1 != (QComboBox *)0x0) {
    QObject::blockSignals(SUB81(pQVar1,0));
  }
  AudioEnumerator::populate(enumerator,index);
  DeviceGroup::populateDevices<AudioEnumerator>(group,enumerator);
  QComboBox::setCurrentIndex((int)group->mDeviceCombo);
  pQVar2 = group->mErrorLabel;
  bVar3 = AudioEnumerator::backendIsAvailable(enumerator,index);
  (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,!bVar3);
  ConfigTab::setDirty<(Config::Category)1>(&this->super_ConfigTab);
  if (pQVar1 == (QComboBox *)0x0) {
    return;
  }
  QObject::blockSignals(SUB81(pQVar1,0));
  return;
}

Assistant:

void SoundConfigTab::apiChanged(Enumerator &enumerator, DeviceGroup *group, int index) {
    QSignalBlocker blocker(group->mDeviceCombo);
    enumerator.populate(index);
    group->populateDevices(enumerator);
    group->mDeviceCombo->setCurrentIndex(0); // default

    group->mErrorLabel->setVisible(!enumerator.backendIsAvailable(index));

    setDirtyFromEnumerator<Enumerator>();

}